

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O2

void __thiscall reader_authority_suite::test_host_regname::test_method(test_host_regname *this)

{
  undefined4 local_120;
  value local_11c;
  view_type local_118;
  undefined8 *local_108;
  char *local_100;
  char input [12];
  authority reader;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_118.ptr_ = input;
  builtin_strncpy(input,"example.com",0xc);
  local_118.len_ = strlen(local_118.ptr_);
  trial::url::reader::basic_authority<char>::basic_authority(&reader,&local_118);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x46);
  local_118.len_ = local_118.len_ & 0xffffffffffffff00;
  local_118.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_58 = "";
  local_11c = trial::url::token::code
                        (reader.super_base<char,_trial::url::reader::basic_authority>.current_token)
  ;
  local_120 = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
            (&local_118,&local_60,0x46,2,2,&local_11c,"reader.code()",&local_120,
             "url::token::code::authority_host");
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x47);
  local_118.len_ = local_118.len_ & 0xffffffffffffff00;
  local_118.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_88 = "";
  local_11c = reader.super_base<char,_trial::url::reader::basic_authority>.current_token;
  local_120 = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_118,&local_90,0x47,2,2,&local_11c,"reader.subcode()",&local_120,
             "url::token::subcode::authority_host_name");
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x48);
  local_118.len_ = local_118.len_ & 0xffffffffffffff00;
  local_118.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b8 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[12]>
            (&local_118,&local_c0,0x48,2,2,
             &reader.super_base<char,_trial::url::reader::basic_authority>.current_view,
             "reader.literal()","example.com","\"example.com\"");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_host_regname)
{
    const char input[] = "example.com";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_host);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_name);
    BOOST_REQUIRE_EQUAL(reader.literal(), "example.com");
}